

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  undefined1 local_68 [8];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature *sig_local;
  uchar *output64_local;
  secp256k1_context *ctx_local;
  
  if (output64 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output64 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_ecdsa_signature_load
              (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_68,sig);
    secp256k1_scalar_get_b32(output64,(secp256k1_scalar *)(s.d + 3));
    secp256k1_scalar_get_b32(output64 + 0x20,(secp256k1_scalar *)local_68);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}